

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O1

ktx_size_t ktxTexture2_calcFaceLodSize(ktxTexture2 *This,ktx_uint32_t level)

{
  ktx_size_t kVar1;
  
  if (This == (ktxTexture2 *)0x0) {
    __assert_fail("This != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/texture2.c"
                  ,0x665,"ktx_size_t ktxTexture2_calcFaceLodSize(ktxTexture2 *, ktx_uint32_t)");
  }
  if (This->supercompressionScheme == KTX_SS_BEGIN_RANGE) {
    if ((This->isCubemap == true) && (This->isArray == false)) {
      kVar1 = ktxTexture_calcImageSize((ktxTexture *)This,level,KTX_FORMAT_VERSION_TWO);
      return kVar1;
    }
    return This->_private->_levelIndex[level].uncompressedByteLength;
  }
  __assert_fail("This->supercompressionScheme == KTX_SS_NONE",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/texture2.c"
                ,0x666,"ktx_size_t ktxTexture2_calcFaceLodSize(ktxTexture2 *, ktx_uint32_t)");
}

Assistant:

ktx_size_t
ktxTexture2_calcFaceLodSize(ktxTexture2* This, ktx_uint32_t level)
{
    assert(This != NULL);
    assert(This->supercompressionScheme == KTX_SS_NONE);
    /*
     * For non-array cubemaps this is the size of a face. For everything
     * else it is the size of the level.
     */
    if (This->isCubemap && !This->isArray)
        return ktxTexture_calcImageSize(ktxTexture(This), level,
                                        KTX_FORMAT_VERSION_TWO);
    else
        return This->_private->_levelIndex[level].uncompressedByteLength;
}